

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsBroker_impl.hpp
# Opt level: O2

void __thiscall
helics::CommsBroker<helics::inproc::InprocComms,_helics::CommonCore>::CommsBroker
          (CommsBroker<helics::inproc::InprocComms,_helics::CommonCore> *this,bool arg)

{
  CommonCore::CommonCore(&this->super_CommonCore,arg);
  (this->super_CommonCore).super_Core._vptr_Core = (_func_int **)&PTR__CommsBroker_004633d8;
  (this->super_CommonCore).super_BrokerBase._vptr_BrokerBase =
       (_func_int **)&PTR__CommsBroker_00463770;
  *(undefined4 *)&(this->super_CommonCore).field_0xd84 = 0;
  (this->comms)._M_t.
  super___uniq_ptr_impl<helics::inproc::InprocComms,_std::default_delete<helics::inproc::InprocComms>_>
  ._M_t.
  super__Tuple_impl<0UL,_helics::inproc::InprocComms_*,_std::default_delete<helics::inproc::InprocComms>_>
  .super__Head_base<0UL,_helics::inproc::InprocComms_*,_false>._M_head_impl = (InprocComms *)0x0;
  (this->brokerInitialized)._M_base._M_i = false;
  loadComms(this);
  return;
}

Assistant:

CommsBroker<COMMS, BrokerT>::CommsBroker(bool arg) noexcept: BrokerT(arg)
{
    static_assert(std::is_base_of<CommsInterface, COMMS>::value,
                  "COMMS object must be a CommsInterface Object");
    static_assert(std::is_base_of<BrokerBase, BrokerT>::value,
                  "Broker must be an object  with a base of BrokerBase");
    loadComms();
}